

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Graph.cpp
# Opt level: O2

Edge<std::pair<double,_double>_> * __thiscall
Vertex<std::pair<double,_double>_>::addEdge
          (Vertex<std::pair<double,_double>_> *this,Vertex<std::pair<double,_double>_> *dest,
          double cost)

{
  Edge<std::pair<double,_double>_> *this_00;
  Edge<std::pair<double,_double>_> *edge;
  
  this_00 = (Edge<std::pair<double,_double>_> *)operator_new(0x18);
  Edge<std::pair<double,_double>_>::Edge(this_00,this,dest,cost);
  edge = this_00;
  std::
  vector<Edge<std::pair<double,_double>_>_*,_std::allocator<Edge<std::pair<double,_double>_>_*>_>::
  push_back(&this->outgoing,&edge);
  std::
  vector<Edge<std::pair<double,_double>_>_*,_std::allocator<Edge<std::pair<double,_double>_>_*>_>::
  push_back(&dest->incoming,&edge);
  return edge;
}

Assistant:

Edge<T>* Vertex<T>::addEdge(Vertex<T> *dest, double cost) {
    Edge<T> *edge = new Edge<T>(this, dest, cost);
    this->outgoing.push_back(edge);
    dest->incoming.push_back(edge);
    return edge;
}